

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O2

void * checkupval(lua_State *L,int argf,int argnup,int *pnup)

{
  lua_Integer lVar1;
  void *pvVar2;
  
  lVar1 = luaL_checkinteger(L,argnup);
  luaL_checktype(L,argf,6);
  pvVar2 = lua_upvalueid(L,argf,(int)lVar1);
  if (pnup != (int *)0x0) {
    if (pvVar2 == (void *)0x0) {
      luaL_argerror(L,argnup,"invalid upvalue index");
    }
    *pnup = (int)lVar1;
  }
  return pvVar2;
}

Assistant:

static void *checkupval (lua_State *L, int argf, int argnup, int *pnup) {
  void *id;
  int nup = (int)luaL_checkinteger(L, argnup);  /* upvalue index */
  luaL_checktype(L, argf, LUA_TFUNCTION);  /* closure */
  id = lua_upvalueid(L, argf, nup);
  if (pnup) {
    luaL_argcheck(L, id != NULL, argnup, "invalid upvalue index");
    *pnup = nup;
  }
  return id;
}